

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_ifspecific.c
# Opt level: O0

void write_packet(rfc5444_writer *wr,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  char *pcVar1;
  uint8_t *buf;
  size_t j;
  size_t i;
  size_t length_local;
  void *buffer_local;
  rfc5444_writer_target *iface_local;
  rfc5444_writer *wr_local;
  
  if (iface == &small_if) {
    printf("Interface 1:\n");
  }
  else {
    printf("Interface 2:\n");
  }
  for (buf = (uint8_t *)0x0; buf < length; buf = buf + 0x20) {
    printf("%04zx:",buf);
    for (j = (size_t)buf; j < length && j < buf + 0x1f; j = j + 1) {
      pcVar1 = "";
      if ((j & 3) == 0) {
        pcVar1 = " ";
      }
      printf("%s%02x",pcVar1,(ulong)*(byte *)((long)buffer + j));
    }
    printf("\n");
  }
  printf("\n");
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *wr __attribute__ ((unused)),
    struct rfc5444_writer_target *iface,
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;

  if (iface == &small_if) {
    printf("Interface 1:\n");
  }
  else {
    printf("Interface 2:\n");
  }

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+31; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");
}